

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QFileSystemComboBox.cpp
# Opt level: O1

void __thiscall QFileSystemComboBox::setRootPath(QFileSystemComboBox *this,QString *rootPath)

{
  QFileSystemComboBoxPrivate *pQVar1;
  undefined1 auStack_28 [16];
  bool local_18;
  
  pQVar1 = this->d;
  local_18 = false;
  pQVar1->initialSorting = true;
  std::_Optional_payload_base<std::pair<int,_QFileInfo>_>::_M_copy_assign
            ((_Optional_payload_base<std::pair<int,_QFileInfo>_> *)&pQVar1->layoutValue,
             (_Optional_payload_base<std::pair<int,_QFileInfo>_> *)auStack_28);
  QFileSystemListView::setRootPath(pQVar1->view,rootPath);
  if (local_18 == true) {
    local_18 = false;
    QFileInfo::~QFileInfo((QFileInfo *)(auStack_28 + 8));
  }
  return;
}

Assistant:

void QFileSystemComboBox::setRootPath(const QString &rootPath) {
    d->setRootPath(rootPath, {});
}